

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_converter.cpp
# Opt level: O1

unsafe_unique_array<char> __thiscall duckdb::AddName(duckdb *this,string *name)

{
  pointer pcVar1;
  void *__s;
  long lVar2;
  size_type sVar3;
  
  sVar3 = name->_M_string_length;
  __s = operator_new__(sVar3 + 1);
  switchD_01306cb1::default(__s,0,sVar3 + 1);
  *(void **)this = __s;
  if (sVar3 != 0) {
    pcVar1 = (name->_M_dataplus)._M_p;
    sVar3 = name->_M_string_length;
    lVar2 = 0;
    do {
      *(char *)((long)__s + lVar2) = pcVar1[lVar2];
      lVar2 = lVar2 + 1;
    } while (sVar3 + (sVar3 == 0) != lVar2);
  }
  *(undefined1 *)((long)__s + sVar3) = 0;
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)this;
}

Assistant:

unsafe_unique_array<char> AddName(const string &name) {
	auto name_ptr = make_unsafe_uniq_array<char>(name.size() + 1);
	for (size_t i = 0; i < name.size(); i++) {
		name_ptr[i] = name[i];
	}
	name_ptr[name.size()] = '\0';
	return name_ptr;
}